

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O1

void cleanup_messages(void)

{
  void *__ptr;
  message *pmVar1;
  long lVar2;
  long lVar3;
  
  pmVar1 = msghistory;
  lVar2 = (long)histsize;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      __ptr = *(void **)((long)&pmVar1->msg + lVar3);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      lVar3 = lVar3 + 0x10;
    } while (lVar2 * 0x10 != lVar3);
  }
  free(msghistory);
  lVar2 = 0;
  prevturn = L'\0';
  msghistory = (message *)0x0;
  last_redraw_curline = L'\0';
  curline = L'\0';
  start_of_turn_curline = L'\xffffffff';
  histpos = L'\0';
  histsize = L'\0';
  do {
    msglines[0][lVar2] = '\0';
    lVar2 = lVar2 + 0x51;
  } while (lVar2 != 0xca8);
  return;
}

Assistant:

void cleanup_messages(void)
{
    int i;

    for (i = 0; i < histsize; i++) {
	if (msghistory[i].msg)
	    free(msghistory[i].msg);
    }
    free(msghistory);
    prevturn = 0;

    /* extra cleanup to prevent old messages from appearing in a new game */
    msghistory = NULL;
    curline = last_redraw_curline = 0;
    start_of_turn_curline = -1;
    histsize = histpos = 0;
    for (i = 0; i < MAX_MSGLINES; i++)
	msglines[i][0] = '\0';
}